

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveReader::Read(CFFPrimitiveReader *this,Byte *ioBuffer,LongBufferSizeType inBufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  EStatusCode status;
  LongBufferSizeType inBufferSize_local;
  Byte *ioBuffer_local;
  CFFPrimitiveReader *this_local;
  
  if (this->mInternalState == eFailure) {
    this_local._4_4_ = eFailure;
  }
  else {
    iVar1 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mCFFFile,ioBuffer,inBufferSize);
    this_local._4_4_ = eFailure;
    if (CONCAT44(extraout_var,iVar1) == inBufferSize) {
      this_local._4_4_ = eSuccess;
    }
    if (this_local._4_4_ == eFailure) {
      this->mInternalState = eFailure;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read(Byte* ioBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mCFFFile->Read(ioBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}